

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  bool bVar1;
  int iVar2;
  TestResult *this_00;
  Arguments *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments;
  int *piVar3;
  DeathTestImpl *in_RDI;
  int in_stack_000000fc;
  char **in_stack_00000100;
  int gtest_retval;
  pid_t child_pid;
  Arguments args;
  string internal_flag;
  string filter_flag;
  int pipe_fd [2];
  int death_test_index;
  TestInfo *info;
  InternalRunDeathTestFlag *flag;
  UnitTestImpl *impl;
  undefined7 in_stack_fffffffffffff960;
  undefined1 in_stack_fffffffffffff967;
  undefined1 uVar4;
  int *in_stack_fffffffffffff978;
  allocator *paVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  allocator local_619;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  int local_534;
  pid_t local_530;
  allocator local_529;
  string local_528 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_508 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  allocator local_471;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  allocator local_309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined4 local_224;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  allocator local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined4 local_134;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_34;
  int local_30;
  int local_2c;
  TestInfo *local_28;
  InternalRunDeathTestFlag *local_20;
  UnitTestImpl *local_18;
  TestRole local_4;
  
  local_18 = GetUnitTestImpl();
  local_20 = UnitTestImpl::internal_run_death_test_flag((UnitTestImpl *)0x1c0c76);
  local_28 = UnitTestImpl::current_test_info(local_18);
  this_00 = TestInfo::result(local_28);
  local_2c = TestResult::death_test_count(this_00);
  if (local_20 == (InternalRunDeathTestFlag *)0x0) {
    do {
      iVar2 = pipe(&local_34);
      bVar1 = IsTrue(iVar2 != -1);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f8,"CHECK failed: File ",&local_f9);
        std::operator+(&local_d8,&local_f8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O0/deps/googletest/src/googletest_project/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_b8,&local_d8,", line ");
        local_134 = 0x543;
        StreamableToString<int>(in_stack_fffffffffffff978);
        std::operator+(&local_98,&local_b8,&local_130);
        std::operator+(&local_78,&local_98,": ");
        std::operator+(&local_58,&local_78,"pipe(pipe_fd) != -1");
        DeathTestAbort((string *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    do {
      iVar2 = fcntl(local_30,2,0);
      bVar1 = IsTrue(iVar2 != -1);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1f8,"CHECK failed: File ",&local_1f9);
        std::operator+(&local_1d8,&local_1f8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O0/deps/googletest/src/googletest_project/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_1b8,&local_1d8,", line ");
        local_224 = 0x546;
        StreamableToString<int>(in_stack_fffffffffffff978);
        std::operator+(&local_198,&local_1b8,&local_220);
        std::operator+(&local_178,&local_198,": ");
        std::operator+(&local_158,&local_178,"fcntl(pipe_fd[1], F_SETFD, 0) != -1");
        DeathTestAbort((string *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960));
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_308,"--",&local_309);
    std::operator+(&local_2e8,&local_308,"gtest_");
    std::operator+(&local_2c8,&local_2e8,"filter");
    std::operator+(&local_2a8,&local_2c8,"=");
    this_01 = (Arguments *)TestInfo::test_case_name((TestInfo *)0x1c12ff);
    std::operator+(&local_288,&local_2a8,(char *)this_01);
    std::operator+(&local_268,&local_288,".");
    arguments = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)TestInfo::name((TestInfo *)0x1c134d);
    std::operator+(&local_248,&local_268,(char *)arguments);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
    paVar5 = &local_471;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_470,"--",paVar5);
    std::operator+(&local_450,&local_470,"gtest_");
    std::operator+(&local_430,&local_450,"internal_run_death_test");
    std::operator+(&local_410,&local_430,"=");
    std::operator+(&local_3f0,&local_410,(char *)in_RDI[1].super_DeathTest._vptr_DeathTest);
    std::operator+(&local_3d0,&local_3f0,"|");
    StreamableToString<int>(in_stack_fffffffffffff978);
    std::operator+(&local_3b0,&local_3d0,&local_498);
    std::operator+(&local_390,&local_3b0,"|");
    StreamableToString<int>(in_stack_fffffffffffff978);
    std::operator+(&local_370,&local_390,&local_4b8);
    std::operator+(&local_350,&local_370,"|");
    StreamableToString<int>(in_stack_fffffffffffff978);
    std::operator+(&local_330,&local_350,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator((allocator<char> *)&local_471);
    Arguments::Arguments((Arguments *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960))
    ;
    GetArgvsForDeathTestChildProcess_abi_cxx11_();
    Arguments::AddArguments<std::__cxx11::string>(this_01,arguments);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_508);
    std::__cxx11::string::c_str();
    Arguments::AddArgument((Arguments *)paVar5,(char *)in_stack_fffffffffffff978);
    std::__cxx11::string::c_str();
    Arguments::AddArgument((Arguments *)paVar5,(char *)in_stack_fffffffffffff978);
    paVar5 = &local_529;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_528,"",paVar5);
    DeathTest::set_last_death_test_message((string *)0x1c16df);
    std::__cxx11::string::~string(local_528);
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
    CaptureStderr();
    FlushInfoLog();
    Arguments::Argv((Arguments *)0x1c1716);
    local_530 = ExecDeathTestSpawnChild(in_stack_00000100,in_stack_000000fc);
    do {
      do {
        local_534 = close(local_30);
        uVar4 = false;
        if (local_534 == -1) {
          piVar3 = __errno_location();
          uVar4 = *piVar3 == 4;
        }
      } while ((bool)uVar4 != false);
      if (local_534 == -1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_618,"CHECK failed: File ",&local_619);
        std::operator+(&local_5f8,&local_618,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O0/deps/googletest/src/googletest_project/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_5d8,&local_5f8,", line ");
        StreamableToString<int>((int *)paVar5);
        std::operator+(&local_5b8,&local_5d8,&local_640);
        std::operator+(&local_598,&local_5b8,": ");
        std::operator+(&local_578,&local_598,"close(pipe_fd[1])");
        std::operator+(&local_558,&local_578," != -1");
        DeathTestAbort((string *)CONCAT17(uVar4,in_stack_fffffffffffff960));
        std::__cxx11::string::~string((string *)&local_558);
        std::__cxx11::string::~string((string *)&local_578);
        std::__cxx11::string::~string((string *)&local_598);
        std::__cxx11::string::~string((string *)&local_5b8);
        std::__cxx11::string::~string((string *)&local_640);
        std::__cxx11::string::~string((string *)&local_5d8);
        std::__cxx11::string::~string((string *)&local_5f8);
        std::__cxx11::string::~string((string *)&local_618);
        std::allocator<char>::~allocator((allocator<char> *)&local_619);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    ForkingDeathTest::set_child_pid((ForkingDeathTest *)in_RDI,local_530);
    DeathTestImpl::set_read_fd(in_RDI,local_34);
    DeathTestImpl::set_spawned(in_RDI,true);
    local_4 = OVERSEE_TEST;
    Arguments::~Arguments((Arguments *)CONCAT17(uVar4,in_stack_fffffffffffff960));
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_248);
  }
  else {
    iVar2 = InternalRunDeathTestFlag::write_fd(local_20);
    DeathTestImpl::set_write_fd(in_RDI,iVar2);
    local_4 = EXECUTE_TEST;
  }
  return local_4;
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != NULL) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kFilterFlag + "="
      + info->test_case_name() + "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}